

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

Vec_Ptr_t * Aig_ManDfsChoices(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    Aig_ManIncrementTravId(p);
    iVar1 = p->nTravIds;
    p->pConst1->TravId = iVar1;
    lVar6 = (long)p->vCis->nSize;
    if (0 < lVar6) {
      ppvVar3 = p->vCis->pArray;
      lVar7 = 0;
      do {
        *(int *)((long)ppvVar3[lVar7] + 0x20) = iVar1;
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
    iVar1 = p->nObjs[5];
    iVar2 = p->nObjs[6];
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = 8;
    if (6 < (iVar2 + iVar1) - 1U) {
      iVar5 = iVar2 + iVar1;
    }
    vNodes->nSize = 0;
    vNodes->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar3 = (void **)0x0;
    }
    else {
      ppvVar3 = (void **)malloc((long)iVar5 << 3);
    }
    vNodes->pArray = ppvVar3;
    pVVar4 = p->vCos;
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        Aig_ManDfsChoices_rec
                  (p,(Aig_Obj_t *)(*(ulong *)((long)pVVar4->pArray[lVar6] + 8) & 0xfffffffffffffffe)
                   ,vNodes);
        lVar6 = lVar6 + 1;
        pVVar4 = p->vCos;
      } while (lVar6 < pVVar4->nSize);
    }
    return vNodes;
  }
  __assert_fail("p->pEquivs != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                ,0x198,"Vec_Ptr_t *Aig_ManDfsChoices(Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t * Aig_ManDfsChoices( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;

    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Aig_ObjEquiv(p, pObj) == NULL )
            continue;
        Counter = 0;
        for ( pObj = Aig_ObjEquiv(p, pObj) ; pObj; pObj = Aig_ObjEquiv(p, pObj) )
            Counter++;
//        printf( "%d ", Counter );
    }
//    printf( "\n" );

    assert( p->pEquivs != NULL );
    Aig_ManIncrementTravId( p );
    // mark constant and PIs
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachCi( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfsChoices_rec( p, Aig_ObjFanin0(pObj), vNodes );
    return vNodes;
}